

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void __thiscall tetgenmesh::flip31(tetgenmesh *this,face *flipfaces,int flipflag)

{
  int iVar1;
  int iVar2;
  shellface ppdVar3;
  shellface ppdVar4;
  shellface ppdVar5;
  shellface *pppdVar6;
  shellface ppdVar7;
  shellface *pppdVar8;
  long lVar9;
  ulong uVar10;
  ulong *puVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  shellface *pppdVar16;
  long lVar17;
  face bdedges [3];
  face bdsegs [3];
  face infaces [3];
  face outfaces [3];
  undefined8 uStack_110;
  face local_108;
  shellface *local_f8;
  int local_f0;
  shellface *local_e8;
  int local_e0;
  face *local_d0;
  ulong uStack_c8;
  ulong auStack_c0 [4];
  long lStack_a0;
  ulong local_98;
  ulong local_90 [4];
  ulong uStack_70;
  ulong uStack_68;
  ulong auStack_60 [6];
  uint uVar15;
  
  lVar12 = 8;
  do {
    *(undefined8 *)((long)&uStack_110 + lVar12) = 0;
    *(undefined4 *)((long)&local_108.sh + lVar12) = 0;
    lVar12 = lVar12 + 0x10;
  } while (lVar12 != 0x38);
  lVar12 = 8;
  do {
    *(undefined8 *)((long)&uStack_70 + lVar12) = 0;
    *(undefined4 *)((long)auStack_60 + lVar12 + -8) = 0;
    lVar12 = lVar12 + 0x10;
  } while (lVar12 != 0x38);
  lVar12 = 8;
  do {
    *(undefined8 *)((long)&lStack_a0 + lVar12) = 0;
    *(undefined4 *)((long)local_90 + lVar12 + -8) = 0;
    lVar12 = lVar12 + 0x10;
  } while (lVar12 != 0x38);
  lVar12 = 8;
  do {
    *(undefined8 *)((long)&local_d0 + lVar12) = 0;
    *(undefined4 *)((long)auStack_c0 + lVar12 + -8) = 0;
    lVar12 = lVar12 + 0x10;
  } while (lVar12 != 0x38);
  ppdVar3 = flipfaces->sh[sdestpivot[flipfaces->shver]];
  ppdVar4 = flipfaces[1].sh[sdestpivot[flipfaces[1].shver]];
  ppdVar5 = flipfaces[2].sh[sdestpivot[flipfaces[2].shver]];
  this->flip31count = this->flip31count + 1;
  lVar12 = 0;
  do {
    pppdVar6 = flipfaces[lVar12].sh;
    (&local_108)[lVar12].sh = pppdVar6;
    iVar1 = snextpivot[flipfaces[lVar12].shver];
    (&local_108)[lVar12].shver = iVar1;
    lVar17 = (long)(iVar1 >> 1);
    ppdVar7 = pppdVar6[lVar17];
    uVar15 = (uint)ppdVar7;
    uVar14 = uVar15 & 7;
    *(uint *)(auStack_60 + lVar12 * 2) = uVar14;
    uVar13 = (ulong)ppdVar7 & 0xfffffffffffffff8;
    auStack_60[lVar12 * 2 + -1] = uVar13;
    local_90[lVar12 * 2 + -1] = uVar13;
    *(uint *)(local_90 + lVar12 * 2) = uVar14;
    ppdVar7 = pppdVar6[lVar17 + 6];
    *(uint *)(auStack_c0 + lVar12 * 2) = (uint)ppdVar7 & 7;
    auStack_c0[lVar12 * 2 + -1] = (ulong)ppdVar7 & 0xfffffffffffffff8;
    if (ppdVar7 != (shellface)0x0 && uVar13 != 0) {
      uVar13 = *(ulong *)(uVar13 + (ulong)(uVar15 & 6) * 4);
      if (pppdVar6 != (shellface *)(uVar13 & 0xfffffffffffffff8)) {
        pppdVar8 = (shellface *)(uVar13 & 0xfffffffffffffff8);
        do {
          pppdVar16 = pppdVar8;
          uVar14 = (uint)uVar13;
          uVar13 = *(ulong *)((long)pppdVar16 + (ulong)(uVar14 & 6) * 4);
          pppdVar8 = (shellface *)(uVar13 & 0xfffffffffffffff8);
        } while (pppdVar6 != (shellface *)(uVar13 & 0xfffffffffffffff8));
        local_90[lVar12 * 2 + -1] = (ulong)pppdVar16;
        *(uint *)(local_90 + lVar12 * 2) = uVar14 & 7;
      }
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  local_d0 = flipfaces + 3;
  uStack_110._4_4_ = flipflag;
  makeshellface(this,this->subfaces,local_d0);
  iVar1 = flipfaces[3].shver;
  flipfaces[3].sh[sorgpivot[iVar1]] = ppdVar3;
  flipfaces[3].sh[sdestpivot[iVar1]] = ppdVar4;
  flipfaces[3].sh[sapexpivot[iVar1]] = ppdVar5;
  pppdVar6 = flipfaces->sh;
  pppdVar8 = flipfaces[3].sh;
  *(undefined4 *)((long)pppdVar8 + (long)this->shmarkindex * 4) =
       *(undefined4 *)((long)pppdVar6 + (long)this->shmarkindex * 4);
  if (this->checkconstraints != 0) {
    pppdVar8[this->areaboundindex] = pppdVar6[this->areaboundindex];
  }
  if (this->useinsertradius != 0) {
    *(undefined4 *)((long)pppdVar8 + (long)this->shmarkindex * 4 + 8) =
         *(undefined4 *)((long)pppdVar6 + (long)this->shmarkindex * 4 + 8);
  }
  lVar12 = (long)this->pointmarkindex;
  if ((*(uint *)((long)ppdVar3 + lVar12 * 4 + 4) & 0xffffff00) == 0x700) {
    ppdVar3[(long)this->point2simindex + 2] = (double *)((long)flipfaces[3].shver | (ulong)pppdVar8)
    ;
  }
  if ((*(uint *)((long)ppdVar4 + lVar12 * 4 + 4) & 0xffffff00) == 0x700) {
    ppdVar4[(long)this->point2simindex + 2] =
         (double *)((long)flipfaces[3].shver | (ulong)flipfaces[3].sh);
  }
  if ((*(uint *)((long)ppdVar5 + lVar12 * 4 + 4) & 0xffffff00) == 0x700) {
    ppdVar5[(long)this->point2simindex + 2] =
         (double *)((long)flipfaces[3].shver | (ulong)flipfaces[3].sh);
  }
  local_108.sh = flipfaces[3].sh;
  iVar1 = flipfaces[3].shver;
  local_108.shver = iVar1;
  local_f8 = local_108.sh;
  local_f0 = snextpivot[iVar1];
  local_e8 = local_108.sh;
  local_e0 = snextpivot[snextpivot[iVar1]];
  lVar12 = (long)sorgpivot[0];
  lVar17 = 8;
  do {
    uVar13 = *(ulong *)((long)&uStack_70 + lVar17);
    if (uVar13 != 0) {
      lVar9 = *(long *)((long)&local_d0 + lVar17);
      if (lVar9 != 0) {
        *(undefined4 *)((long)auStack_c0 + lVar17 + -8) = 0;
        uVar14 = *(uint *)((long)&local_108.sh + lVar17);
        if (*(long *)(*(long *)((long)&uStack_110 + lVar17) + (long)sorgpivot[(int)uVar14] * 8) !=
            *(long *)(lVar9 + lVar12 * 8)) {
          *(uint *)((long)&local_108.sh + lVar17) = uVar14 ^ 1;
        }
      }
      uVar10 = *(ulong *)((long)&uStack_110 + lVar17);
      iVar2 = *(int *)((long)&local_108.sh + lVar17);
      *(ulong *)(uVar10 + (long)(iVar2 >> 1) * 8) =
           (long)*(int *)((long)auStack_60 + lVar17 + -8) | uVar13;
      *(ulong *)(*(long *)((long)&lStack_a0 + lVar17) +
                (long)(*(int *)((long)local_90 + lVar17 + -8) >> 1) * 8) = (long)iVar2 | uVar10;
    }
    puVar11 = *(ulong **)((long)&local_d0 + lVar17);
    if (puVar11 != (ulong *)0x0) {
      uVar13 = *(ulong *)((long)&uStack_110 + lVar17);
      iVar2 = *(int *)((long)&local_108.sh + lVar17);
      *(ulong *)(uVar13 + 0x30 + (long)(iVar2 >> 1) * 8) =
           (long)*(int *)((long)auStack_c0 + lVar17 + -8) | (ulong)puVar11;
      *puVar11 = (long)iVar2 | uVar13;
    }
    lVar17 = lVar17 + 0x10;
  } while (lVar17 != 0x38);
  (this->recentsh).sh = local_d0->sh;
  (this->recentsh).shver = iVar1;
  if (uStack_110._4_4_ != 0) {
    lVar12 = 0;
    do {
      flipshpush(this,(face *)((long)&local_108.sh + lVar12));
      lVar12 = lVar12 + 0x10;
    } while (lVar12 != 0x30);
  }
  return;
}

Assistant:

void tetgenmesh::flip31(face* flipfaces, int flipflag)
{
  face bdedges[3], outfaces[3], infaces[3];
  face bdsegs[3];
  face checkface;
  point pa, pb, pc;
  int i;

  pa = sdest(flipfaces[0]);
  pb = sdest(flipfaces[1]);
  pc = sdest(flipfaces[2]);

  flip31count++;

  // Collect all infos at the three boundary edges.
  for (i = 0; i < 3; i++) {
    senext(flipfaces[i], bdedges[i]);
    spivot(bdedges[i], outfaces[i]);
    infaces[i] = outfaces[i];
    sspivot(bdedges[i], bdsegs[i]);
    if (outfaces[i].sh != NULL) {
      if (isshsubseg(bdedges[i])) {
        spivot(infaces[i], checkface);
        while (checkface.sh != bdedges[i].sh) {
          infaces[i] = checkface;
          spivot(infaces[i], checkface);
        }
      }
    }
  } // i

  // Create a new subface.
  makeshellface(subfaces, &(flipfaces[3]));
  setshvertices(flipfaces[3], pa, pb,pc);
  setshellmark(flipfaces[3], shellmark(flipfaces[0]));
  if (checkconstraints) {
    //area = areabound(flipfaces[0]);
    setareabound(flipfaces[3], areabound(flipfaces[0]));
  }
  if (useinsertradius) {
    setfacetindex(flipfaces[3], getfacetindex(flipfaces[0]));
  }

  // Update the point-to-subface map.
  if (pointtype(pa) == FREEFACETVERTEX) {
    setpoint2sh(pa, sencode(flipfaces[3]));
  }
  if (pointtype(pb) == FREEFACETVERTEX) {
    setpoint2sh(pb, sencode(flipfaces[3]));
  }
  if (pointtype(pc) == FREEFACETVERTEX) {
    setpoint2sh(pc, sencode(flipfaces[3]));
  }

  // Update the three new boundary edges.
  bdedges[0] = flipfaces[3];         // [a,b]
  senext(flipfaces[3], bdedges[1]);  // [b,c]
  senext2(flipfaces[3], bdedges[2]); // [c,a]

  // Reconnect boundary edges to outer boundary faces.
  for (i = 0; i < 3; i++) {
    if (outfaces[i].sh != NULL) {
      // Make sure that the subface has the ori as the segment.
      if (bdsegs[i].sh != NULL) {
        bdsegs[i].shver = 0;
        if (sorg(bdedges[i]) != sorg(bdsegs[i])) {
          sesymself(bdedges[i]);
        }
      }
      sbond1(bdedges[i], outfaces[i]);
      sbond1(infaces[i], bdedges[i]);
    }
    if (bdsegs[i].sh != NULL) {
      ssbond(bdedges[i], bdsegs[i]);
    }
  }

  recentsh = flipfaces[3];

  if (flipflag) {
    // Put the boundary edges into flip stack.
    for (i = 0; i < 3; i++) {
      flipshpush(&(bdedges[i]));
    }
  }
}